

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O1

ComponentSet __thiscall amrex::ForkJoin::ComponentBounds(ForkJoin *this,string *name,int idx)

{
  _Hash_node_base *p_Var1;
  char cVar2;
  BoxArray *__args;
  const_iterator cVar3;
  DistributionMapping *__args_1;
  ComponentSet CVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  char *this_00;
  _Hash_node_base *p_Var9;
  int task_idx;
  ulong uVar10;
  ostringstream *this_01;
  int iStack_204;
  long lStack_200;
  vector<amrex::MultiFab,std::allocator<amrex::MultiFab>> *pvStack_1f8;
  FabArray<amrex::FArrayBox> *pFStack_1f0;
  IntVect *pIStack_1e8;
  DistributionMapping *pDStack_1e0;
  BoxArray *pBStack_1d8;
  Print PStack_1d0;
  ForkJoin *pFStack_48;
  
  cVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->data)._M_h,name);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    return *(ComponentSet *)
            (*(long *)(*(long *)((long)cVar3.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_true>
                                       ._M_cur + 0x28) + 0x20 + (long)idx * 0x50) +
            (long)this->task_me * 8);
  }
  this_00 = "_Map_base::at";
  std::__throw_out_of_range("_Map_base::at");
  pFStack_48 = this;
  if (((ForkJoin *)this_00)->flag_verbose == true) {
    PStack_1d0.os = OutStream();
    PStack_1d0.rank = *(int *)(DAT_00756620 + -0x30);
    PStack_1d0.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&PStack_1d0.ss);
    *(undefined8 *)(&PStack_1d0.field_0x18 + *(long *)(PStack_1d0._16_8_ + -0x18)) =
         *(undefined8 *)(PStack_1d0.os + *(long *)(*(long *)PStack_1d0.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&PStack_1d0.ss,"Copying data into fork-join tasks ...\n",0x26);
    Print::~Print(&PStack_1d0);
  }
  for (p_Var1 = (((ForkJoin *)this_00)->data)._M_h._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    p_Var9 = p_Var1[5]._M_nxt;
    if (p_Var1[6]._M_nxt != p_Var9 && -1 < (long)p_Var1[6]._M_nxt - (long)p_Var9) {
      lVar6 = 0;
      do {
        pvStack_1f8 = (vector<amrex::MultiFab,std::allocator<amrex::MultiFab>> *)
                      (p_Var9 + lVar6 * 10 + 7);
        pFStack_1f0 = (FabArray<amrex::FArrayBox> *)p_Var9[lVar6 * 10]._M_nxt;
        lStack_200 = lVar6;
        std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::reserve
                  ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)pvStack_1f8,
                   ((long)(((ForkJoin *)this_00)->split_bounds).
                          super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(((ForkJoin *)this_00)->split_bounds).
                         super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000 >> 0x20);
        if (0 < (int)((ulong)((long)(((ForkJoin *)this_00)->split_bounds).
                                    super_vector<int,_std::allocator<int>_>.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(((ForkJoin *)this_00)->split_bounds).
                                   super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2) + -1) {
          pBStack_1d8 = &(pFStack_1f0->super_FabArrayBase).boxarray;
          pDStack_1e0 = &(pFStack_1f0->super_FabArrayBase).distributionMap;
          pIStack_1e8 = (IntVect *)((long)&p_Var9[lVar6 * 10 + 2]._M_nxt + 4);
          lVar7 = 0;
          uVar10 = 0;
          do {
            this_01 = &PStack_1d0.ss;
            if ((*(int *)&p_Var9[lVar6 * 10 + 1]._M_nxt == 0) &&
               (uVar10 != *(uint *)&p_Var9[lVar6 * 10 + 2]._M_nxt)) {
              lVar5 = ((long)p_Var9[lVar6 * 10 + 8]._M_nxt - (long)p_Var9[lVar6 * 10 + 7]._M_nxt >>
                      7) * -0x5555555555555555;
              if (lVar5 - uVar10 == 0 || lVar5 < (long)uVar10) {
                MultiFab::MultiFab((MultiFab *)&PStack_1d0);
                std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::
                emplace_back<amrex::MultiFab>
                          ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)pvStack_1f8,
                           (MultiFab *)&PStack_1d0);
                MultiFab::~MultiFab((MultiFab *)&PStack_1d0);
              }
            }
            else {
              iStack_204 = *(int *)((long)&p_Var9[lVar6 * 10 + 4]._M_nxt[uVar10]._M_nxt + 4) -
                           *(int *)&p_Var9[lVar6 * 10 + 4]._M_nxt[uVar10]._M_nxt;
              lVar5 = ((long)p_Var9[lVar6 * 10 + 8]._M_nxt - (long)p_Var9[lVar6 * 10 + 7]._M_nxt >>
                      7) * -0x5555555555555555;
              task_idx = (int)uVar10;
              cVar2 = (char)this_01;
              if (lVar5 - uVar10 == 0 || lVar5 < (long)uVar10) {
                if (((ForkJoin *)this_00)->flag_verbose != false) {
                  PStack_1d0.os = OutStream();
                  PStack_1d0.rank = *(int *)(DAT_00756620 + -0x30);
                  PStack_1d0.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
                  *(undefined8 *)(&PStack_1d0.field_0x18 + *(long *)(PStack_1d0._16_8_ + -0x18)) =
                       *(undefined8 *)
                        (PStack_1d0.os + *(long *)(*(long *)PStack_1d0.os + -0x18) + 8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_01,"  Creating forked ",0x12);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_01,(char *)p_Var1[1]._M_nxt,(long)p_Var1[2]._M_nxt);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"[",1);
                  std::ostream::operator<<(this_01,(int)lStack_200);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_01,"] for task ",0xb);
                  std::ostream::operator<<(this_01,task_idx);
                  pcVar8 = " (whole)";
                  if (*(int *)&p_Var9[lVar6 * 10 + 1]._M_nxt == 2) {
                    pcVar8 = " (split)";
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar8,8);
                  std::ios::widen((char)*(undefined8 *)(PStack_1d0._16_8_ + -0x18) + cVar2);
                  std::ostream::put(cVar2);
                  std::ostream::flush();
                  Print::~Print(&PStack_1d0);
                }
                __args = pBStack_1d8;
                __args_1 = get_dm((ForkJoin *)this_00,pBStack_1d8,task_idx,pDStack_1e0);
                std::vector<amrex::MultiFab,std::allocator<amrex::MultiFab>>::
                emplace_back<amrex::BoxArray_const&,amrex::DistributionMapping_const&,int&,amrex::IntVect&>
                          (pvStack_1f8,__args,__args_1,&iStack_204,pIStack_1e8);
              }
              else if (((ForkJoin *)this_00)->flag_verbose != false) {
                PStack_1d0.os = OutStream();
                PStack_1d0.rank = *(int *)(DAT_00756620 + -0x30);
                PStack_1d0.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
                *(undefined8 *)(&PStack_1d0.field_0x18 + *(long *)(PStack_1d0._16_8_ + -0x18)) =
                     *(undefined8 *)(PStack_1d0.os + *(long *)(*(long *)PStack_1d0.os + -0x18) + 8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"  Forked ",9)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_01,(char *)p_Var1[1]._M_nxt,(long)p_Var1[2]._M_nxt);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"[",1);
                std::ostream::operator<<(this_01,(int)lStack_200);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_01,"] for task ",0xb);
                std::ostream::operator<<(this_01,task_idx);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_01," already created",0x10);
                std::ios::widen((char)*(undefined8 *)(PStack_1d0._16_8_ + -0x18) + cVar2);
                std::ostream::put(cVar2);
                std::ostream::flush();
                Print::~Print(&PStack_1d0);
              }
              if (((ulong)p_Var9[lVar6 * 10 + 1]._M_nxt & 0xfffffffd00000000) == 0) {
                if (((ForkJoin *)this_00)->flag_verbose == true) {
                  PStack_1d0.os = OutStream();
                  PStack_1d0.rank = *(int *)(DAT_00756620 + -0x30);
                  PStack_1d0.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
                  *(undefined8 *)(&PStack_1d0.field_0x18 + *(long *)(PStack_1d0._16_8_ + -0x18)) =
                       *(undefined8 *)
                        (PStack_1d0.os + *(long *)(*(long *)PStack_1d0.os + -0x18) + 8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_01,"    Copying ",0xc);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_01,(char *)p_Var1[1]._M_nxt,(long)p_Var1[2]._M_nxt);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"[",1);
                  std::ostream::operator<<(this_01,(int)lStack_200);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_01,"] components [",0xe);
                  std::ostream::operator<<
                            (this_01,*(int *)&p_Var9[lVar6 * 10 + 4]._M_nxt[uVar10]._M_nxt);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
                  std::ostream::operator<<
                            (this_01,*(int *)((long)&p_Var9[lVar6 * 10 + 4]._M_nxt[uVar10]._M_nxt +
                                             4));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_01,") into to task ",0xf);
                  std::ostream::operator<<(this_01,task_idx);
                  std::ios::widen((char)*(undefined8 *)(PStack_1d0._16_8_ + -0x18) + cVar2);
                  std::ostream::put(cVar2);
                  std::ostream::flush();
                  Print::~Print(&PStack_1d0);
                }
                FabArray<amrex::FArrayBox>::Redistribute
                          ((FabArray<amrex::FArrayBox> *)
                           ((long)&(p_Var9[lVar6 * 10 + 7]._M_nxt)->_M_nxt + lVar7),pFStack_1f0,
                           *(int *)&p_Var9[lVar6 * 10 + 4]._M_nxt[uVar10]._M_nxt,0,iStack_204,
                           pIStack_1e8);
              }
            }
            uVar10 = uVar10 + 1;
            lVar7 = lVar7 + 0x180;
          } while ((long)uVar10 <
                   ((long)(((ForkJoin *)this_00)->split_bounds).
                          super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(((ForkJoin *)this_00)->split_bounds).
                         super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000 >> 0x20);
        }
        lVar6 = lStack_200 + 1;
        p_Var9 = p_Var1[5]._M_nxt;
        lVar7 = ((long)p_Var1[6]._M_nxt - (long)p_Var9 >> 4) * -0x3333333333333333;
      } while (lVar7 - lVar6 != 0 && lVar6 <= lVar7);
    }
  }
  CVar4.lo = 0;
  CVar4.hi = 0;
  return CVar4;
}

Assistant:

ForkJoin::ComponentSet
ForkJoin::ComponentBounds(const std::string& name, int idx) const
{
    const auto & mffork_vec = data.at(name);
    BL_ASSERT(idx >= 0 && idx < mffork_vec.size());
    return mffork_vec[idx].comp_split[task_me];
}